

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void vmaEndDefragmentation
               (VmaAllocator allocator,VmaDefragmentationContext context,
               VmaDefragmentationStats *pStats)

{
  VkDeviceSize VVar1;
  uint32_t uVar2;
  
  if (pStats == (VmaDefragmentationStats *)0x0) {
    if (context == (VmaDefragmentationContext)0x0) {
      return;
    }
  }
  else {
    uVar2 = (context->m_GlobalStats).deviceMemoryBlocksFreed;
    pStats->allocationsMoved = (context->m_GlobalStats).allocationsMoved;
    pStats->deviceMemoryBlocksFreed = uVar2;
    VVar1 = (context->m_GlobalStats).bytesFreed;
    pStats->bytesMoved = (context->m_GlobalStats).bytesMoved;
    pStats->bytesFreed = VVar1;
  }
  VmaDefragmentationContext_T::~VmaDefragmentationContext_T(context);
  VmaFree(&allocator->m_AllocationCallbacks,context);
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaEndDefragmentation(
    VmaAllocator allocator,
    VmaDefragmentationContext context,
    VmaDefragmentationStats* pStats)
{
    VMA_ASSERT(allocator && context);

    VMA_DEBUG_LOG("vmaEndDefragmentation");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    if (pStats)
        context->GetStats(*pStats);
    vma_delete(allocator, context);
}